

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O2

void __thiscall RenX::PlayerInfo::start_resolve_rdns(PlayerInfo *this)

{
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  rdns_string;
  thread tStack_28;
  __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  local_20;
  
  this->rdns_pending = true;
  std::make_shared<std::__cxx11::string>();
  std::
  __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ::operator=(&(this->m_rdns_ptr).
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ,&local_20);
  std::thread::
  thread<void(&)(std::__cxx11::string,std::shared_ptr<std::__cxx11::string>),std::__cxx11::string&,std::shared_ptr<std::__cxx11::string>,void>
            (&tStack_28,resolve_rdns,&this->ip,
             (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_20);
  std::thread::detach();
  std::thread::~thread(&tStack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

void RenX::PlayerInfo::start_resolve_rdns() {
	rdns_pending = true;

	auto rdns_string = std::make_shared<std::string>();
	m_rdns_ptr = rdns_string;
	std::thread(resolve_rdns, ip, std::move(rdns_string)).detach();
}